

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O3

int AF_A_JumpIfInTargetInventory
              (VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  undefined8 *puVar1;
  PClass *pPVar2;
  int iVar3;
  PClass *pPVar4;
  VMValue *pVVar5;
  AActor *self;
  AActor *owner;
  char *__assertion;
  bool bVar6;
  bool bVar7;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0066bf8b;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0066bf72:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0066bf8b:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x540,
                  "int AF_A_JumpIfInTargetInventory(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  puVar1 = (undefined8 *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (puVar1 == (undefined8 *)0x0) goto LAB_0066bf33;
    pPVar4 = (PClass *)puVar1[1];
    pVVar5 = param;
    if (pPVar4 == (PClass *)0x0) {
      pPVar4 = (PClass *)(**(code **)*puVar1)(puVar1);
      puVar1[1] = pPVar4;
    }
    bVar6 = pPVar4 == (PClass *)0x0;
    bVar7 = !bVar6;
    self = (AActor *)CONCAT71((int7)((ulong)pVVar5 >> 8),pPVar4 == pPVar2 || bVar6);
    if (pPVar4 != pPVar2 && !bVar6) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar7 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar2) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (!bVar7) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0066bf8b;
    }
    owner = (AActor *)puVar1[0x3b];
    if (owner != (AActor *)0x0) {
      if (((owner->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_0066bf54;
      puVar1[0x3b] = 0;
    }
  }
  else {
    if (puVar1 != (undefined8 *)0x0) goto LAB_0066bf72;
LAB_0066bf33:
    self = (AActor *)param;
    if (_DAT_000001d8 != (AActor *)0x0) {
      owner = _DAT_000001d8;
      if (((_DAT_000001d8->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0)
      goto LAB_0066bf54;
      _DAT_000001d8 = (AActor *)0x0;
    }
  }
  owner = (AActor *)0x0;
LAB_0066bf54:
  iVar3 = DoJumpIfInventory(owner,self,param,numparam,ret,numret);
  return iVar3;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_JumpIfInTargetInventory)
{
	PARAM_SELF_PROLOGUE(AActor);
	return DoJumpIfInventory(self->target, self, param, numparam, ret, numret);
}